

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O0

AggregateFunction * duckdb::GetSumAggregateNoOverflowDecimal(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction *in_RDI;
  bind_aggregate_function_t unaff_retaddr;
  aggregate_destructor_t in_stack_00000008;
  aggregate_statistics_t in_stack_00000010;
  aggregate_window_t in_stack_00000018;
  aggregate_serialize_t in_stack_00000020;
  aggregate_deserialize_t in_stack_00000028;
  AggregateFunction *aggr;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_a8;
  AggregateFunction *update;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  aggregate_size_t in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  AggregateFunction *in_stack_ffffffffffffffa0;
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  aggregate_combine_t in_stack_ffffffffffffffe0;
  aggregate_finalize_t in_stack_ffffffffffffffe8;
  FunctionNullHandling in_stack_fffffffffffffff0;
  AggregateFunction *simple_update;
  
  update = in_RDI;
  simple_update = in_RDI;
  duckdb::LogicalType::LogicalType(local_50,DECIMAL);
  local_38 = local_50;
  local_30 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x827f07);
  iVar1._M_array._4_4_ = in_stack_fffffffffffffedc;
  iVar1._M_array._0_4_ = in_stack_fffffffffffffed8;
  iVar1._M_len = in_stack_fffffffffffffee0;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff80,DECIMAL);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(aggregate_update_t)update,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,
             (aggregate_simple_update_t)simple_update,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x827fe2);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x827fef);
  local_a8 = (LogicalType *)&local_38;
  do {
    local_a8 = local_a8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_a8);
  } while (local_a8 != local_50);
  in_RDI->serialize = SumNoOverflowSerialize;
  in_RDI->deserialize = SumNoOverflowDeserialize;
  return update;
}

Assistant:

AggregateFunction GetSumAggregateNoOverflowDecimal() {
	AggregateFunction aggr({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr, nullptr,
	                       nullptr, FunctionNullHandling::DEFAULT_NULL_HANDLING, nullptr, SumNoOverflowBind);
	aggr.serialize = SumNoOverflowSerialize;
	aggr.deserialize = SumNoOverflowDeserialize;
	return aggr;
}